

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::GreatestCommonDivisorFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  ScalarFunctionSet *in_RDI;
  ScalarFunctionSet *funcs;
  allocator_type *in_stack_fffffffffffffb58;
  ScalarFunction *pSVar3;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffb60;
  ScalarFunction *pSVar4;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffb68;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *__f;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffb74;
  LogicalTypeId in_stack_fffffffffffffb7f;
  LogicalType *in_stack_fffffffffffffb80;
  LogicalType *this;
  ScalarFunctionSet *in_stack_fffffffffffffba0;
  undefined1 **local_418;
  undefined1 **local_3f8;
  bind_scalar_function_extended_t in_stack_fffffffffffffc80;
  bind_scalar_function_extended_t bind_extended;
  bind_scalar_function_t in_stack_fffffffffffffc88;
  scalar_function_t *in_stack_fffffffffffffc90;
  LogicalType *in_stack_fffffffffffffc98;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffca0;
  ScalarFunction *in_stack_fffffffffffffca8;
  undefined1 *local_348;
  undefined8 local_340;
  function_statistics_t in_stack_fffffffffffffce0;
  init_local_state_t in_stack_fffffffffffffce8;
  LogicalType *in_stack_fffffffffffffcf0;
  FunctionStability in_stack_fffffffffffffcf8;
  FunctionNullHandling in_stack_fffffffffffffd00;
  bind_lambda_function_t in_stack_fffffffffffffd08;
  undefined1 local_1f8 [96];
  undefined8 *local_198;
  undefined1 *local_190 [3];
  undefined1 local_178 [24];
  undefined8 *local_160;
  undefined8 local_158;
  undefined1 local_9;
  
  local_9 = 0;
  ScalarFunctionSet::ScalarFunctionSet(in_stack_fffffffffffffba0);
  local_198 = local_190;
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  local_198 = (undefined8 *)local_178;
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  local_160 = local_190;
  local_158 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x207d368);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffb70;
  iVar1._M_array = (iterator)in_stack_fffffffffffffb68;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffb74;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffb60,iVar1,in_stack_fffffffffffffb58);
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),in_stack_fffffffffffffb68
            );
  LogicalType::LogicalType(in_stack_fffffffffffffb80,in_stack_fffffffffffffb7f);
  __f = (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)local_1f8;
  this = (LogicalType *)0x0;
  uVar5 = 0;
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  LogicalType::~LogicalType((LogicalType *)0x207d45c);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x207d469);
  LogicalType::~LogicalType((LogicalType *)0x207d476);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x207d483);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x207d490);
  local_3f8 = (undefined1 **)&local_160;
  do {
    local_3f8 = local_3f8 + -3;
    LogicalType::~LogicalType((LogicalType *)0x207d4c5);
  } while (local_3f8 != local_190);
  LogicalType::LogicalType(this,in_stack_fffffffffffffb7f);
  bind_extended = (bind_scalar_function_extended_t)&stack0xfffffffffffffca0;
  LogicalType::LogicalType(this,in_stack_fffffffffffffb7f);
  local_348 = &stack0xfffffffffffffc88;
  local_340 = 2;
  ::std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x207d54b);
  iVar2._M_len._0_4_ = uVar5;
  iVar2._M_array = (iterator)__f;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffb74;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)pSVar4,iVar2,(allocator_type *)pSVar3);
  LogicalType::LogicalType(this,in_stack_fffffffffffffb7f);
  ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffb74,uVar5),__f);
  LogicalType::LogicalType(this,in_stack_fffffffffffffb7f);
  pSVar4 = (ScalarFunction *)0x0;
  pSVar3 = (ScalarFunction *)0x0;
  ScalarFunction::ScalarFunction
            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
             in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,bind_extended,
             in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0,
             in_stack_fffffffffffffcf8,in_stack_fffffffffffffd00,in_stack_fffffffffffffd08);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)pSVar4,pSVar3);
  ScalarFunction::~ScalarFunction(pSVar4);
  LogicalType::~LogicalType((LogicalType *)0x207d63f);
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
  ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
            0x207d64c);
  LogicalType::~LogicalType((LogicalType *)0x207d659);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x207d666);
  ::std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x207d673);
  local_418 = &local_348;
  do {
    local_418 = local_418 + -3;
    LogicalType::~LogicalType((LogicalType *)0x207d6a8);
  } while (local_418 != (undefined1 **)&stack0xfffffffffffffc88);
  return in_RDI;
}

Assistant:

ScalarFunctionSet GreatestCommonDivisorFun::GetFunctions() {
	ScalarFunctionSet funcs;
	funcs.AddFunction(
	    ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT}, LogicalType::BIGINT,
	                   ScalarFunction::BinaryFunction<int64_t, int64_t, int64_t, GreatestCommonDivisorOperator>));
	funcs.AddFunction(
	    ScalarFunction({LogicalType::HUGEINT, LogicalType::HUGEINT}, LogicalType::HUGEINT,
	                   ScalarFunction::BinaryFunction<hugeint_t, hugeint_t, hugeint_t, GreatestCommonDivisorOperator>));
	return funcs;
}